

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O1

MaybeStackArray<char,_40> * __thiscall
icu_63::MaybeStackArray<char,_40>::operator=
          (MaybeStackArray<char,_40> *this,MaybeStackArray<char,_40> *src)

{
  char *__src;
  
  if (this->needToRelease != '\0') {
    uprv_free_63(this->ptr);
  }
  this->capacity = src->capacity;
  this->needToRelease = src->needToRelease;
  __src = src->stackArray;
  if (src->ptr == __src) {
    this->ptr = this->stackArray;
    memcpy(this->stackArray,__src,(long)src->capacity);
  }
  else {
    this->ptr = src->ptr;
    src->ptr = __src;
    src->capacity = 0x28;
    src->needToRelease = '\0';
  }
  return this;
}

Assistant:

inline MaybeStackArray <T, stackCapacity>&
MaybeStackArray<T, stackCapacity>::operator=(MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT {
    releaseArray();  // in case this instance had its own memory allocated
    capacity = src.capacity;
    needToRelease = src.needToRelease;
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        ptr = src.ptr;
        src.resetToStackArray();  // take ownership away from src
    }
    return *this;
}